

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpComms::queue_tx_function(TcpComms *this)

{
  _Atomic_word *p_Var1;
  ulong uVar2;
  ActionMessage *this_00;
  ActionMessage *act;
  _Rb_tree_color _Var3;
  TcpConnection *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TcpComms *this_02;
  undefined4 uVar5;
  element_type *this_03;
  _Head_base<0UL,_asio::io_context::work_*,_false> _Var6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  _Head_base<0UL,_asio::io_context::work_*,_false> _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  _Rb_tree_node_base *p_Var12;
  _Head_base<0UL,_asio::io_context::work_*,_false> __n;
  void *__buf;
  _Head_base<0UL,_asio::io_context::work_*,_false> _Var13;
  void *__buf_00;
  void *__buf_01;
  ActionMessage *command;
  ActionMessage *pAVar14;
  undefined8 uVar15;
  ulong uVar16;
  _Alloc_hider _Var17;
  string *in_R8;
  string_view message;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  pVar18;
  string interface;
  string newroute;
  string port;
  ActionMessage m;
  pointer brokerConnection;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  _Alloc_hider local_2b8;
  _Base_ptr local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  TcpComms *local_258;
  route_id local_250 [10];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [5];
  shared_ptr<gmlc::networking::TcpConnection> local_168;
  undefined1 local_150 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_140;
  SocketFactory local_138;
  undefined1 local_120 [8];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  __native_type local_d8;
  undefined8 local_b0;
  byte abStack_a8 [64];
  long lStack_68;
  undefined8 local_60;
  byte *local_58;
  _Any_data local_50;
  _Manager_type local_40;
  _Invoker_type p_Stack_38;
  
  local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00;
  local_228._0_8_ = &local_218;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)(local_150 + 8),(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &local_218) {
    operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
  }
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory(&local_138,&this->encryption_config,true);
  }
  else {
    local_138.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_138.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_138.encrypted = false;
    local_138.handshake_server = false;
    local_138._18_6_ = 0;
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)local_150);
  local_168.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (TcpConnection *)0x0;
  local_168.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __n._M_head_impl = (work *)(local_118 + 8);
  local_118._8_4_ = _S_red;
  local_118._16_8_ = (_Rb_tree_node_base *)0x0;
  local_f8._8_8_ = 0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_118._24_8_ = __n._M_head_impl;
  local_f8._0_8_ = __n._M_head_impl;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar8 = getDefaultPort(6);
      LOCK();
      (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar8;
      UNLOCK();
      ActionMessage::ActionMessage((ActionMessage *)local_228,cmd_protocol);
      local_228._4_4_ = 0x5ab;
      local_218._M_allocated_capacity._4_4_ =
           (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &this->rxMessageQueue,(ActionMessage *)local_228);
      ActionMessage::~ActionMessage((ActionMessage *)local_228);
    }
  }
  else {
    bVar7 = establishBrokerConnection
                      (this,(shared_ptr<gmlc::networking::AsioContextManager> *)(local_150 + 8),
                       &local_168);
    if (!bVar7) {
      ActionMessage::ActionMessage((ActionMessage *)local_228,cmd_protocol);
      local_228._4_4_ = 0x16570bf;
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &this->rxMessageQueue,(ActionMessage *)local_228);
      ActionMessage::~ActionMessage((ActionMessage *)local_228);
      goto LAB_0026704e;
    }
  }
  CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
  local_120 = (undefined1  [8])&this->rxMessageQueue;
  this_00 = (ActionMessage *)(local_f8 + 0x10);
  local_258 = this;
LAB_0026619c:
  local_f8._16_8_ = 0;
  local_f8._24_8_ = 0x9aac0f0000000000;
  local_d8.__data._0_8_ = (__pthread_internal_list *)0x9aac0f0000000000;
  abStack_a8[0x38] = 0;
  abStack_a8[0x39] = 0;
  abStack_a8[0x3a] = 0;
  abStack_a8[0x3b] = 0;
  abStack_a8[0x3c] = 0;
  abStack_a8[0x3d] = 0;
  abStack_a8[0x3e] = 0;
  abStack_a8[0x3f] = 0;
  lStack_68 = 0;
  abStack_a8[0x28] = 0;
  abStack_a8[0x29] = 0;
  abStack_a8[0x2a] = 0;
  abStack_a8[0x2b] = 0;
  abStack_a8[0x2c] = 0;
  abStack_a8[0x2d] = 0;
  abStack_a8[0x2e] = 0;
  abStack_a8[0x2f] = 0;
  abStack_a8[0x30] = 0;
  abStack_a8[0x31] = 0;
  abStack_a8[0x32] = 0;
  abStack_a8[0x33] = 0;
  abStack_a8[0x34] = 0;
  abStack_a8[0x35] = 0;
  abStack_a8[0x36] = 0;
  abStack_a8[0x37] = 0;
  abStack_a8[0x18] = 0;
  abStack_a8[0x19] = 0;
  abStack_a8[0x1a] = 0;
  abStack_a8[0x1b] = 0;
  abStack_a8[0x1c] = 0;
  abStack_a8[0x1d] = 0;
  abStack_a8[0x1e] = 0;
  abStack_a8[0x1f] = 0;
  abStack_a8[0x20] = 0;
  abStack_a8[0x21] = 0;
  abStack_a8[0x22] = 0;
  abStack_a8[0x23] = 0;
  abStack_a8[0x24] = 0;
  abStack_a8[0x25] = 0;
  abStack_a8[0x26] = 0;
  abStack_a8[0x27] = 0;
  abStack_a8[8] = 0;
  abStack_a8[9] = 0;
  abStack_a8[10] = 0;
  abStack_a8[0xb] = 0;
  abStack_a8[0xc] = 0;
  abStack_a8[0xd] = 0;
  abStack_a8[0xe] = 0;
  abStack_a8[0xf] = 0;
  abStack_a8[0x10] = 0;
  abStack_a8[0x11] = 0;
  abStack_a8[0x12] = 0;
  abStack_a8[0x13] = 0;
  abStack_a8[0x14] = 0;
  abStack_a8[0x15] = 0;
  abStack_a8[0x16] = 0;
  abStack_a8[0x17] = 0;
  local_b0._0_1_ = (condition_variable)0x0;
  local_b0._1_7_ = 0;
  abStack_a8[0] = 0;
  abStack_a8[1] = 0;
  abStack_a8[2] = 0;
  abStack_a8[3] = 0;
  abStack_a8[4] = 0;
  abStack_a8[5] = 0;
  abStack_a8[6] = 0;
  abStack_a8[7] = 0;
  local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_d8.__data._8_8_ = 0;
  local_d8._16_8_ = (element_type *)0x0;
  local_60 = 0x40;
  local_58 = abStack_a8;
  local_40 = (_Manager_type)0x0;
  p_Stack_38 = (_Invoker_type)0x0;
  local_50._M_unused._M_object = (void *)0x0;
  local_50._8_8_ = 0;
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_228,
        &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue);
  uVar5 = local_228._0_4_;
  act = (ActionMessage *)(local_228 + 8);
  pAVar14 = act;
  ActionMessage::operator=(this_00,act);
  ActionMessage::~ActionMessage(act);
  this_03 = local_168.
            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = (int)(TcpConnection *)local_228;
  if (((local_f8._16_4_ != -60000) && (local_f8._16_4_ != 0x1000ea60)) && (local_f8._16_4_ != 60000)
     ) {
    if (uVar5 != cmd_broker_setup) {
      if (uVar5 != cmd_ignore) goto LAB_002662cd;
      goto LAB_00266297;
    }
LAB_00266355:
    gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
    push<helics::ActionMessage&>
              ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)local_120,
               this_00);
    goto LAB_0026642c;
  }
  if (uVar5 == cmd_ignore) {
LAB_00266297:
    if (((local_258->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      ActionMessage::packetize_abi_cxx11_((string *)local_228,this_00);
      gmlc::networking::TcpConnection::send(this_03,iVar8,__buf,(size_t)__n._M_head_impl,(int)in_R8)
      ;
LAB_00266407:
      uVar15 = local_218._M_allocated_capacity;
      _Var17._M_p = (pointer)local_228._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ != &local_218) goto LAB_00266424;
    }
  }
  else if (uVar5 == cmd_broker_setup) {
    if (local_f8._20_4_ == 0xf4) {
      local_228._0_4_ = local_d8._4_4_;
      pVar18 = std::
               _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               ::equal_range((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                              *)local_118,(key_type *)local_228);
      std::
      _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
      ::_M_erase_aux((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                      *)local_118,(_Base_ptr)pVar18.first._M_node,(_Base_ptr)pVar18.second._M_node);
      goto LAB_0026642c;
    }
    if (local_f8._20_4_ != 0xe9) {
      if (local_f8._20_4_ != 0x9db) goto LAB_00266355;
      ActionMessage::~ActionMessage((ActionMessage *)(local_f8 + 0x10));
      for (p_Var12 = (_Rb_tree_node_base *)local_118._24_8_;
          p_Var12 != (_Rb_tree_node_base *)(local_118 + 8);
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        gmlc::networking::TcpConnection::close((TcpConnection *)p_Var12[1]._M_parent,(int)pAVar14);
      }
      std::
      _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
      ::clear((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               *)local_118);
      this_02 = local_258;
      if ((local_258->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED)
      {
        closeReceiver(local_258);
      }
      CommsInterface::setTxStatus((CommsInterface *)this_02,TERMINATED);
LAB_0026704e:
      std::
      _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
      ::~_Rb_tree((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                   *)local_118);
      if (local_168.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_168.
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
      ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                     *)local_150);
      if (local_138.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
          super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)
                   ((long)local_138.super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                          _M_weak_this.
                          super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 0xc);
          iVar8 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar8 = *(_Atomic_word *)
                   ((long)local_138.super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                          _M_weak_this.
                          super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 0xc);
          *(int *)((long)local_138.super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                         _M_weak_this.
                         super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 0xc) = iVar8 + -1;
        }
        if (iVar8 == 1) {
          (**(code **)(*(long *)local_138.
                                super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                                _M_weak_this.
                                super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 0x18))();
        }
      }
      if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_pi);
      }
      return;
    }
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,local_58,local_58 + lStack_68);
    local_2b8._M_p = (pointer)&local_2a8;
    local_2b0 = (_Base_ptr)0x0;
    local_2a8._M_local_buf[0] = '\0';
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    gmlc::networking::extractInterfaceAndPortString
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_228,(string *)&local_298);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_278,local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208[0]._M_dataplus._M_p != &local_208[0].field_2) {
      operator_delete(local_208[0]._M_dataplus._M_p,local_208[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
    }
    in_R8 = (string *)&local_278;
    __n._M_head_impl = (work *)&local_2b8;
    gmlc::networking::TcpConnection::create
              ((TcpConnection *)local_228,&local_138,
               (((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)
                (local_150._8_8_ + 0x40))->_M_t).
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,(string *)&local_2b8,
               in_R8,0x27d0);
    local_250[0].rid = local_d8._4_4_;
    std::
    _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
    ::_M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
              ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                *)local_118,local_250,(shared_ptr<gmlc::networking::TcpConnection> *)local_228);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar15 = CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                        local_278.field_2._M_local_buf[0]);
      _Var17._M_p = local_278._M_dataplus._M_p;
LAB_002666b6:
      operator_delete(_Var17._M_p,uVar15 + 1);
    }
LAB_002666be:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_p != &local_2a8) {
      operator_delete(local_2b8._M_p,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    uVar15 = local_298.field_2._M_allocated_capacity;
    _Var17._M_p = local_298._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
LAB_00266424:
      operator_delete(_Var17._M_p,uVar15 + 1);
    }
  }
  else {
LAB_002662cd:
    if ((_Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>)
        local_118._16_8_ != (work *)0x0) {
      _Var10._M_head_impl = (work *)(local_118 + 8);
      _Var6._M_head_impl = (work *)local_118._16_8_;
      do {
        _Var13._M_head_impl = _Var6._M_head_impl;
        __n._M_head_impl = _Var10._M_head_impl;
        _Var3 = ((_Rb_tree_node_base *)(_Var13._M_head_impl + 4))->_M_color;
        _Var10._M_head_impl = _Var13._M_head_impl;
        if ((int)_Var3 < (int)uVar5) {
          _Var10._M_head_impl = __n._M_head_impl;
        }
        _Var6._M_head_impl =
             (work *)_Var13._M_head_impl[(ulong)((int)_Var3 < (int)uVar5) + 2].io_context_impl_;
      } while (_Var13._M_head_impl[(ulong)((int)_Var3 < (int)uVar5) + 2].io_context_impl_ !=
               (io_context_impl *)0x0);
      if (_Var10._M_head_impl != (work *)(local_118 + 8)) {
        if ((int)_Var3 < (int)uVar5) {
          _Var13._M_head_impl = __n._M_head_impl;
        }
        if ((int)((_Rb_tree_node_base *)((long)_Var13._M_head_impl + 0x20))->_M_color <= (int)uVar5)
        {
          this_01 = *(TcpConnection **)((long)_Var10._M_head_impl + 0x28);
          ActionMessage::packetize_abi_cxx11_((string *)local_228,this_00);
          gmlc::networking::TcpConnection::send
                    (this_01,iVar8,__buf_01,(size_t)__n._M_head_impl,(int)in_R8);
          goto LAB_00266407;
        }
      }
    }
    if (((local_258->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      ActionMessage::packetize_abi_cxx11_((string *)local_228,this_00);
      gmlc::networking::TcpConnection::send
                (this_03,iVar8,__buf_00,(size_t)__n._M_head_impl,(int)in_R8);
      goto LAB_00266407;
    }
    if ((int)local_f8._16_4_ < 0x87) {
      uVar9 = local_f8._16_4_ + 3;
      if ((0x26 < uVar9) ||
         ((__n._M_head_impl = (work *)0x600001fe1, (0x600001fe1U >> ((ulong)uVar9 & 0x3f) & 1) == 0
          && (((ulong)uVar9 != 0x26 ||
              ((element_type *)local_d8._16_8_ != (element_type *)0x7fffffffffffffff)))))) {
LAB_00266457:
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"(tcp) unknown message destination message dropped ","");
        prettyPrintString_abi_cxx11_((string *)&local_2b8,(helics *)this_00,command);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar15 = local_298.field_2._M_allocated_capacity;
        }
        uVar2 = (long)&((_Alloc_hider *)local_298._M_string_length)->_M_p +
                (long)&local_2b0->_M_color;
        in_R8 = (string *)local_298._M_string_length;
        if ((ulong)uVar15 < uVar2) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_p != &local_2a8) {
            uVar16 = CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]);
          }
          if (uVar16 < uVar2) goto LAB_002664d1;
          pbVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_2b8,0,0,local_298._M_dataplus._M_p,local_298._M_string_length)
          ;
        }
        else {
LAB_002664d1:
          pbVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              (&local_298,local_2b8._M_p,(size_type)local_2b0);
        }
        local_228._0_8_ = &local_218;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar11->_M_dataplus)._M_p;
        __n._M_head_impl = (work *)&pbVar11->field_2;
        if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__n._M_head_impl) {
          local_218._M_allocated_capacity = (size_type)*__n._M_head_impl;
          local_218._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        }
        else {
          local_218._M_allocated_capacity = (size_type)*__n._M_head_impl;
          local_228._0_8_ = paVar4;
        }
        local_228._8_8_ = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)__n._M_head_impl;
        pbVar11->_M_string_length = 0;
        *(char *)__n._M_head_impl = '\0';
        message._M_str = (char *)local_228._0_8_;
        message._M_len = local_228._8_8_;
        CommsInterface::logWarning((CommsInterface *)local_258,message);
        uVar15 = local_218._M_allocated_capacity;
        _Var17._M_p = (pointer)local_228._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._0_8_ != &local_218) goto LAB_002666b6;
        goto LAB_002666be;
      }
    }
    else {
      uVar9 = local_f8._16_4_ - 0x3ee;
      __n._M_head_impl = (work *)(ulong)uVar9;
      if (((3 < uVar9) || (uVar9 == 1)) && ((local_f8._16_4_ != 0x87 && (local_f8._16_4_ != 0x89))))
      goto LAB_00266457;
    }
  }
LAB_0026642c:
  ActionMessage::~ActionMessage(this_00);
  goto LAB_0026619c;
}

Assistant:

void TcpComms::queue_tx_function()
{
    // std::vector<char> buffer;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (!establishBrokerConnection(ioctx, brokerConnection)) {
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = CLOSE_RECEIVER;
            rxMessageQueue.push(m);
            return;
        }
    } else {
        if (PortNumber < 0) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = PORT_DEFINITIONS;
            m.setExtraData(PortNumber);
            rxMessageQueue.push(m);
        }
    }
    setTxStatus(ConnectionStatus::CONNECTED);

    //  std::vector<ActionMessage> txlist;
    bool processing{true};
    while (processing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                switch (cmd.messageID) {
                    case NEW_ROUTE: {
                        std::string newroute(cmd.payload.to_string());

                        try {
                            std::string interface;
                            std::string port;
                            std::tie(interface, port) =
                                gmlc::networking::extractInterfaceAndPortString(newroute);
                            auto new_connect =
                                TcpConnection::create(sf, ioctx->getBaseContext(), interface, port);

                            routes.emplace(route_id{cmd.getExtraData()}, std::move(new_connect));
                        }
                        catch (std::exception& e) {
                            logWarning(std::string("unable to create route ") + newroute +
                                       "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        rxMessageQueue.push(cmd);
                        processed = true;
                        break;
                    case DISCONNECT:
                        processing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if (hasBroker) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }

                // if (error)
                {
                    //     std::cerr << "transmit failure to broker " << error.message() <<
                    //     '\n';
                }
            }
        } else if (rid == control_route) {  // send to rx thread loop
            rxMessageQueue.push(cmd);
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcp) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    for (auto& rt : routes) {
        rt.second->close();
    }
    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        closeReceiver();
    }
    setTxStatus(ConnectionStatus::TERMINATED);
}